

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O1

CURLcode Curl_ntlm_core_mk_nt_hash(char *password,uchar *ntbuffer)

{
  CURLcode CVar1;
  size_t sVar2;
  curl_malloc_callback *pp_Var3;
  uchar *input;
  size_t sVar4;
  char *pcVar5;
  
  sVar2 = strlen(password);
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (-1 < (long)sVar2) {
    if (sVar2 == 0) {
      pcVar5 = "";
      pp_Var3 = (curl_malloc_callback *)&Curl_cstrdup;
    }
    else {
      pp_Var3 = &Curl_cmalloc;
      pcVar5 = (char *)(sVar2 * 2);
    }
    input = (uchar *)(**pp_Var3)(pcVar5);
    if (input != (uchar *)0x0) {
      if (sVar2 != 0) {
        sVar4 = 0;
        do {
          input[sVar4 * 2] = password[sVar4];
          input[sVar4 * 2 + 1] = '\0';
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
      }
      CVar1 = Curl_md4it(ntbuffer,input,sVar2 * 2);
      if (CVar1 == CURLE_OK) {
        ntbuffer[0x14] = '\0';
        ntbuffer[0x10] = '\0';
        ntbuffer[0x11] = '\0';
        ntbuffer[0x12] = '\0';
        ntbuffer[0x13] = '\0';
      }
      (*Curl_cfree)(input);
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ntlm_core_mk_nt_hash(const char *password,
                                   unsigned char *ntbuffer /* 21 bytes */)
{
  size_t len = strlen(password);
  unsigned char *pw;
  CURLcode result;
  if(len > SIZE_T_MAX/2) /* avoid integer overflow */
    return CURLE_OUT_OF_MEMORY;
  pw = len ? malloc(len * 2) : (unsigned char *)strdup("");
  if(!pw)
    return CURLE_OUT_OF_MEMORY;

  ascii_to_unicode_le(pw, password, len);

  /* Create NT hashed password. */
  result = Curl_md4it(ntbuffer, pw, 2 * len);
  if(!result)
    memset(ntbuffer + 16, 0, 21 - 16);

  free(pw);

  return result;
}